

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cpp
# Opt level: O0

int __thiscall ncnn::RNN::load_model(RNN *this,ModelBin *mb)

{
  int *piVar1;
  ulong uVar2;
  void **ppvVar3;
  long *in_RSI;
  long in_RDI;
  bool bVar4;
  int size;
  int num_directions;
  void *local_420;
  int *local_418;
  long *local_400;
  void *local_3d8;
  int *local_3d0;
  undefined8 local_3c8;
  undefined4 local_3c0;
  long *local_3b8;
  undefined4 local_3b0;
  undefined4 local_3ac;
  undefined4 local_3a8;
  undefined4 local_3a4;
  undefined4 local_3a0;
  undefined8 local_398;
  void *local_390;
  int *local_388;
  undefined8 local_380;
  undefined4 local_378;
  long *local_370;
  undefined4 local_368;
  undefined4 local_364;
  undefined4 local_360;
  undefined4 local_35c;
  undefined4 local_358;
  undefined8 local_350;
  void *local_348;
  int *local_340;
  undefined8 local_338;
  undefined4 local_330;
  long *local_328;
  undefined4 local_320;
  undefined4 local_31c;
  undefined4 local_318;
  undefined4 local_314;
  undefined4 local_310;
  undefined8 local_308;
  void *local_2f0;
  int *local_2e8;
  undefined8 local_2e0;
  undefined4 local_2d8;
  long *local_2d0;
  undefined4 local_2c8;
  undefined4 local_2c4;
  undefined4 local_2c0;
  undefined4 local_2bc;
  undefined4 local_2b8;
  undefined8 local_2b0;
  undefined4 local_2a8;
  int local_2a4;
  long *local_2a0;
  int local_28c;
  void **local_288;
  void **local_278;
  void **local_268;
  void **local_258;
  void **local_248;
  int local_238;
  undefined4 local_234;
  void **local_230;
  void **local_228;
  void **local_220;
  int local_218;
  undefined4 local_214;
  void **local_210;
  void **local_208;
  void **local_200;
  int local_1f8;
  undefined4 local_1f4;
  void **local_1f0;
  void **local_1e8;
  void **local_1e0;
  int local_1d8;
  undefined4 local_1d4;
  void **local_1d0;
  void **local_1c8;
  void **local_1c0;
  int local_1b8;
  undefined4 local_1b4;
  void **local_1b0;
  void **local_1a8;
  void **local_1a0;
  long *local_198;
  long *local_190;
  long *local_188;
  int local_180;
  undefined4 local_17c;
  void **local_178;
  int local_170;
  undefined4 local_16c;
  void **local_168;
  int local_160;
  undefined4 local_15c;
  void **local_158;
  int local_150;
  undefined4 local_14c;
  void **local_148;
  int local_140;
  undefined4 local_13c;
  void **local_138;
  int local_120;
  undefined4 local_11c;
  void **local_118;
  int local_100;
  undefined4 local_fc;
  void **local_f8;
  int local_e0;
  undefined4 local_dc;
  void **local_d8;
  int local_c0;
  undefined4 local_bc;
  void **local_b8;
  int local_a0;
  undefined4 local_9c;
  void **local_98;
  void *local_40;
  void *local_38;
  void *local_30;
  void *local_28;
  void *local_20;
  long *local_18;
  long *local_10;
  long *local_8;
  
  local_2a4 = 1;
  if (*(int *)(in_RDI + 0xd8) == 2) {
    local_2a4 = 2;
  }
  uVar2 = (long)*(int *)(in_RDI + 0xd4) / (long)local_2a4;
  uVar2 = (long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) /
          (long)*(int *)(in_RDI + 0xd0);
  local_2a8 = (undefined4)uVar2;
  local_2a0 = in_RSI;
  (**(code **)(*in_RSI + 0x20))
            (&local_2f0,in_RSI,uVar2 & 0xffffffff,*(undefined4 *)(in_RDI + 0xd0),local_2a4,0);
  ppvVar3 = (void **)(in_RDI + 0x128);
  local_1b0 = &local_2f0;
  local_1a8 = ppvVar3;
  if (ppvVar3 != local_1b0) {
    if (local_2e8 != (int *)0x0) {
      local_1b4 = 1;
      LOCK();
      local_1b8 = *local_2e8;
      *local_2e8 = *local_2e8 + 1;
      UNLOCK();
    }
    local_178 = ppvVar3;
    if (*(long *)(in_RDI + 0x130) != 0) {
      piVar1 = *(int **)(in_RDI + 0x130);
      local_17c = 0xffffffff;
      LOCK();
      local_180 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_180 == 1) {
        if (*(long *)(in_RDI + 0x148) == 0) {
          local_20 = *ppvVar3;
          if (local_20 != (void *)0x0) {
            free(local_20);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0x148) + 0x18))(*(long **)(in_RDI + 0x148),*ppvVar3);
        }
      }
    }
    *ppvVar3 = (void *)0x0;
    *(undefined8 *)(in_RDI + 0x138) = 0;
    *(undefined4 *)(in_RDI + 0x140) = 0;
    *(undefined4 *)(in_RDI + 0x150) = 0;
    *(undefined4 *)(in_RDI + 0x154) = 0;
    *(undefined4 *)(in_RDI + 0x158) = 0;
    *(undefined4 *)(in_RDI + 0x15c) = 0;
    *(undefined4 *)(in_RDI + 0x160) = 0;
    *(undefined8 *)(in_RDI + 0x168) = 0;
    *(undefined8 *)(in_RDI + 0x130) = 0;
    *ppvVar3 = *local_1b0;
    *(void **)(in_RDI + 0x130) = local_1b0[1];
    *(void **)(in_RDI + 0x138) = local_1b0[2];
    *(undefined4 *)(in_RDI + 0x140) = *(undefined4 *)(local_1b0 + 3);
    *(void **)(in_RDI + 0x148) = local_1b0[4];
    *(undefined4 *)(in_RDI + 0x150) = *(undefined4 *)(local_1b0 + 5);
    *(undefined4 *)(in_RDI + 0x154) = *(undefined4 *)((long)local_1b0 + 0x2c);
    *(undefined4 *)(in_RDI + 0x158) = *(undefined4 *)(local_1b0 + 6);
    *(undefined4 *)(in_RDI + 0x15c) = *(undefined4 *)((long)local_1b0 + 0x34);
    *(undefined4 *)(in_RDI + 0x160) = *(undefined4 *)(local_1b0 + 7);
    *(void **)(in_RDI + 0x168) = local_1b0[8];
  }
  local_288 = &local_2f0;
  local_1a0 = ppvVar3;
  local_98 = local_288;
  if (local_2e8 != (int *)0x0) {
    local_9c = 0xffffffff;
    LOCK();
    local_a0 = *local_2e8;
    *local_2e8 = *local_2e8 + -1;
    UNLOCK();
    if (local_a0 == 1) {
      if (local_2d0 == (long *)0x0) {
        if (local_2f0 != (void *)0x0) {
          free(local_2f0);
        }
      }
      else {
        (**(code **)(*local_2d0 + 0x18))(local_2d0,local_2f0);
      }
    }
  }
  local_2f0 = (void *)0x0;
  local_2e0 = 0;
  local_2d8 = 0;
  local_2c8 = 0;
  local_2c4 = 0;
  local_2c0 = 0;
  local_2bc = 0;
  local_2b8 = 0;
  local_2b0 = 0;
  local_2e8 = (int *)0x0;
  local_188 = (long *)(in_RDI + 0x128);
  bVar4 = true;
  if (*local_188 != 0) {
    bVar4 = *(long *)(in_RDI + 0x168) * (long)*(int *)(in_RDI + 0x160) == 0;
    local_18 = local_188;
  }
  if (bVar4) {
    local_28c = -100;
  }
  else {
    (**(code **)(*local_2a0 + 0x20))
              (&local_348,local_2a0,*(undefined4 *)(in_RDI + 0xd0),1,local_2a4,0);
    ppvVar3 = (void **)(in_RDI + 0x170);
    local_1d0 = &local_348;
    local_1c8 = ppvVar3;
    if (ppvVar3 != local_1d0) {
      if (local_340 != (int *)0x0) {
        local_1d4 = 1;
        LOCK();
        local_1d8 = *local_340;
        *local_340 = *local_340 + 1;
        UNLOCK();
      }
      local_168 = ppvVar3;
      if (*(long *)(in_RDI + 0x178) != 0) {
        piVar1 = *(int **)(in_RDI + 0x178);
        local_16c = 0xffffffff;
        LOCK();
        local_170 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_170 == 1) {
          if (*(long *)(in_RDI + 400) == 0) {
            local_28 = *ppvVar3;
            if (local_28 != (void *)0x0) {
              free(local_28);
            }
          }
          else {
            (**(code **)(**(long **)(in_RDI + 400) + 0x18))(*(long **)(in_RDI + 400),*ppvVar3);
          }
        }
      }
      *ppvVar3 = (void *)0x0;
      *(undefined8 *)(in_RDI + 0x180) = 0;
      *(undefined4 *)(in_RDI + 0x188) = 0;
      *(undefined4 *)(in_RDI + 0x198) = 0;
      *(undefined4 *)(in_RDI + 0x19c) = 0;
      *(undefined4 *)(in_RDI + 0x1a0) = 0;
      *(undefined4 *)(in_RDI + 0x1a4) = 0;
      *(undefined4 *)(in_RDI + 0x1a8) = 0;
      *(undefined8 *)(in_RDI + 0x1b0) = 0;
      *(undefined8 *)(in_RDI + 0x178) = 0;
      *ppvVar3 = *local_1d0;
      *(void **)(in_RDI + 0x178) = local_1d0[1];
      *(void **)(in_RDI + 0x180) = local_1d0[2];
      *(undefined4 *)(in_RDI + 0x188) = *(undefined4 *)(local_1d0 + 3);
      *(void **)(in_RDI + 400) = local_1d0[4];
      *(undefined4 *)(in_RDI + 0x198) = *(undefined4 *)(local_1d0 + 5);
      *(undefined4 *)(in_RDI + 0x19c) = *(undefined4 *)((long)local_1d0 + 0x2c);
      *(undefined4 *)(in_RDI + 0x1a0) = *(undefined4 *)(local_1d0 + 6);
      *(undefined4 *)(in_RDI + 0x1a4) = *(undefined4 *)((long)local_1d0 + 0x34);
      *(undefined4 *)(in_RDI + 0x1a8) = *(undefined4 *)(local_1d0 + 7);
      *(void **)(in_RDI + 0x1b0) = local_1d0[8];
    }
    local_278 = &local_348;
    local_1c0 = ppvVar3;
    local_b8 = local_278;
    if (local_340 != (int *)0x0) {
      local_bc = 0xffffffff;
      LOCK();
      local_c0 = *local_340;
      *local_340 = *local_340 + -1;
      UNLOCK();
      if (local_c0 == 1) {
        if (local_328 == (long *)0x0) {
          if (local_348 != (void *)0x0) {
            free(local_348);
          }
        }
        else {
          (**(code **)(*local_328 + 0x18))(local_328,local_348);
        }
      }
    }
    local_348 = (void *)0x0;
    local_338 = 0;
    local_330 = 0;
    local_320 = 0;
    local_31c = 0;
    local_318 = 0;
    local_314 = 0;
    local_310 = 0;
    local_308 = 0;
    local_340 = (int *)0x0;
    local_190 = (long *)(in_RDI + 0x170);
    bVar4 = true;
    if (*local_190 != 0) {
      bVar4 = *(long *)(in_RDI + 0x1b0) * (long)*(int *)(in_RDI + 0x1a8) == 0;
      local_10 = local_190;
    }
    if (bVar4) {
      local_28c = -100;
    }
    else {
      (**(code **)(*local_2a0 + 0x20))
                (&local_390,local_2a0,*(undefined4 *)(in_RDI + 0xd0),*(undefined4 *)(in_RDI + 0xd0),
                 local_2a4,0);
      ppvVar3 = (void **)(in_RDI + 0xe0);
      local_1f0 = &local_390;
      local_1e8 = ppvVar3;
      if (ppvVar3 != local_1f0) {
        if (local_388 != (int *)0x0) {
          local_1f4 = 1;
          LOCK();
          local_1f8 = *local_388;
          *local_388 = *local_388 + 1;
          UNLOCK();
        }
        local_158 = ppvVar3;
        if (*(long *)(in_RDI + 0xe8) != 0) {
          piVar1 = *(int **)(in_RDI + 0xe8);
          local_15c = 0xffffffff;
          LOCK();
          local_160 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (local_160 == 1) {
            if (*(long *)(in_RDI + 0x100) == 0) {
              local_30 = *ppvVar3;
              if (local_30 != (void *)0x0) {
                free(local_30);
              }
            }
            else {
              (**(code **)(**(long **)(in_RDI + 0x100) + 0x18))(*(long **)(in_RDI + 0x100),*ppvVar3)
              ;
            }
          }
        }
        *ppvVar3 = (void *)0x0;
        *(undefined8 *)(in_RDI + 0xf0) = 0;
        *(undefined4 *)(in_RDI + 0xf8) = 0;
        *(undefined4 *)(in_RDI + 0x108) = 0;
        *(undefined4 *)(in_RDI + 0x10c) = 0;
        *(undefined4 *)(in_RDI + 0x110) = 0;
        *(undefined4 *)(in_RDI + 0x114) = 0;
        *(undefined4 *)(in_RDI + 0x118) = 0;
        *(undefined8 *)(in_RDI + 0x120) = 0;
        *(undefined8 *)(in_RDI + 0xe8) = 0;
        *ppvVar3 = *local_1f0;
        *(void **)(in_RDI + 0xe8) = local_1f0[1];
        *(void **)(in_RDI + 0xf0) = local_1f0[2];
        *(undefined4 *)(in_RDI + 0xf8) = *(undefined4 *)(local_1f0 + 3);
        *(void **)(in_RDI + 0x100) = local_1f0[4];
        *(undefined4 *)(in_RDI + 0x108) = *(undefined4 *)(local_1f0 + 5);
        *(undefined4 *)(in_RDI + 0x10c) = *(undefined4 *)((long)local_1f0 + 0x2c);
        *(undefined4 *)(in_RDI + 0x110) = *(undefined4 *)(local_1f0 + 6);
        *(undefined4 *)(in_RDI + 0x114) = *(undefined4 *)((long)local_1f0 + 0x34);
        *(undefined4 *)(in_RDI + 0x118) = *(undefined4 *)(local_1f0 + 7);
        *(void **)(in_RDI + 0x120) = local_1f0[8];
      }
      local_268 = &local_390;
      local_1e0 = ppvVar3;
      local_d8 = local_268;
      if (local_388 != (int *)0x0) {
        local_dc = 0xffffffff;
        LOCK();
        local_e0 = *local_388;
        *local_388 = *local_388 + -1;
        UNLOCK();
        if (local_e0 == 1) {
          if (local_370 == (long *)0x0) {
            if (local_390 != (void *)0x0) {
              free(local_390);
            }
          }
          else {
            (**(code **)(*local_370 + 0x18))(local_370,local_390);
          }
        }
      }
      local_390 = (void *)0x0;
      local_380 = 0;
      local_378 = 0;
      local_368 = 0;
      local_364 = 0;
      local_360 = 0;
      local_35c = 0;
      local_358 = 0;
      local_350 = 0;
      local_388 = (int *)0x0;
      local_198 = (long *)(in_RDI + 0xe0);
      bVar4 = true;
      if (*local_198 != 0) {
        bVar4 = *(long *)(in_RDI + 0x120) * (long)*(int *)(in_RDI + 0x118) == 0;
        local_8 = local_198;
      }
      if (bVar4) {
        local_28c = -100;
      }
      else {
        if (*(int *)(in_RDI + 0xdc) != 0) {
          (**(code **)(*local_2a0 + 0x18))
                    (&local_3d8,local_2a0,*(undefined4 *)(in_RDI + 0xd0),local_2a4,1);
          ppvVar3 = (void **)(in_RDI + 0x200);
          local_210 = &local_3d8;
          local_208 = ppvVar3;
          if (ppvVar3 != local_210) {
            if (local_3d0 != (int *)0x0) {
              local_214 = 1;
              LOCK();
              local_218 = *local_3d0;
              *local_3d0 = *local_3d0 + 1;
              UNLOCK();
            }
            local_148 = ppvVar3;
            if (*(long *)(in_RDI + 0x208) != 0) {
              piVar1 = *(int **)(in_RDI + 0x208);
              local_14c = 0xffffffff;
              LOCK();
              local_150 = *piVar1;
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (local_150 == 1) {
                if (*(long *)(in_RDI + 0x220) == 0) {
                  local_38 = *ppvVar3;
                  if (local_38 != (void *)0x0) {
                    free(local_38);
                  }
                }
                else {
                  (**(code **)(**(long **)(in_RDI + 0x220) + 0x18))
                            (*(long **)(in_RDI + 0x220),*ppvVar3);
                }
              }
            }
            *ppvVar3 = (void *)0x0;
            *(undefined8 *)(in_RDI + 0x210) = 0;
            *(undefined4 *)(in_RDI + 0x218) = 0;
            *(undefined4 *)(in_RDI + 0x228) = 0;
            *(undefined4 *)(in_RDI + 0x22c) = 0;
            *(undefined4 *)(in_RDI + 0x230) = 0;
            *(undefined4 *)(in_RDI + 0x234) = 0;
            *(undefined4 *)(in_RDI + 0x238) = 0;
            *(undefined8 *)(in_RDI + 0x240) = 0;
            *(undefined8 *)(in_RDI + 0x208) = 0;
            *ppvVar3 = *local_210;
            *(void **)(in_RDI + 0x208) = local_210[1];
            *(void **)(in_RDI + 0x210) = local_210[2];
            *(undefined4 *)(in_RDI + 0x218) = *(undefined4 *)(local_210 + 3);
            *(void **)(in_RDI + 0x220) = local_210[4];
            *(undefined4 *)(in_RDI + 0x228) = *(undefined4 *)(local_210 + 5);
            *(undefined4 *)(in_RDI + 0x22c) = *(undefined4 *)((long)local_210 + 0x2c);
            *(undefined4 *)(in_RDI + 0x230) = *(undefined4 *)(local_210 + 6);
            *(undefined4 *)(in_RDI + 0x234) = *(undefined4 *)((long)local_210 + 0x34);
            *(undefined4 *)(in_RDI + 0x238) = *(undefined4 *)(local_210 + 7);
            *(void **)(in_RDI + 0x240) = local_210[8];
          }
          local_258 = &local_3d8;
          local_200 = ppvVar3;
          local_f8 = local_258;
          if (local_3d0 != (int *)0x0) {
            local_fc = 0xffffffff;
            LOCK();
            local_100 = *local_3d0;
            *local_3d0 = *local_3d0 + -1;
            UNLOCK();
            if (local_100 == 1) {
              if (local_3b8 == (long *)0x0) {
                if (local_3d8 != (void *)0x0) {
                  free(local_3d8);
                }
              }
              else {
                (**(code **)(*local_3b8 + 0x18))(local_3b8,local_3d8);
              }
            }
          }
          local_3d8 = (void *)0x0;
          local_3c8 = 0;
          local_3c0 = 0;
          local_3b0 = 0;
          local_3ac = 0;
          local_3a8 = 0;
          local_3a4 = 0;
          local_3a0 = 0;
          local_398 = 0;
          local_3d0 = (int *)0x0;
          (**(code **)(*local_2a0 + 0x18))
                    (&local_420,local_2a0,*(undefined4 *)(in_RDI + 0xd0),local_2a4,1);
          ppvVar3 = (void **)(in_RDI + 0x1b8);
          local_230 = &local_420;
          local_228 = ppvVar3;
          if (ppvVar3 != local_230) {
            if (local_418 != (int *)0x0) {
              local_234 = 1;
              LOCK();
              local_238 = *local_418;
              *local_418 = *local_418 + 1;
              UNLOCK();
            }
            local_138 = ppvVar3;
            if (*(long *)(in_RDI + 0x1c0) != 0) {
              piVar1 = *(int **)(in_RDI + 0x1c0);
              local_13c = 0xffffffff;
              LOCK();
              local_140 = *piVar1;
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (local_140 == 1) {
                if (*(long *)(in_RDI + 0x1d8) == 0) {
                  local_40 = *ppvVar3;
                  if (local_40 != (void *)0x0) {
                    free(local_40);
                  }
                }
                else {
                  (**(code **)(**(long **)(in_RDI + 0x1d8) + 0x18))
                            (*(long **)(in_RDI + 0x1d8),*ppvVar3);
                }
              }
            }
            *ppvVar3 = (void *)0x0;
            *(undefined8 *)(in_RDI + 0x1c8) = 0;
            *(undefined4 *)(in_RDI + 0x1d0) = 0;
            *(undefined4 *)(in_RDI + 0x1e0) = 0;
            *(undefined4 *)(in_RDI + 0x1e4) = 0;
            *(undefined4 *)(in_RDI + 0x1e8) = 0;
            *(undefined4 *)(in_RDI + 0x1ec) = 0;
            *(undefined4 *)(in_RDI + 0x1f0) = 0;
            *(undefined8 *)(in_RDI + 0x1f8) = 0;
            *(undefined8 *)(in_RDI + 0x1c0) = 0;
            *ppvVar3 = *local_230;
            *(void **)(in_RDI + 0x1c0) = local_230[1];
            *(void **)(in_RDI + 0x1c8) = local_230[2];
            *(undefined4 *)(in_RDI + 0x1d0) = *(undefined4 *)(local_230 + 3);
            *(void **)(in_RDI + 0x1d8) = local_230[4];
            *(undefined4 *)(in_RDI + 0x1e0) = *(undefined4 *)(local_230 + 5);
            *(undefined4 *)(in_RDI + 0x1e4) = *(undefined4 *)((long)local_230 + 0x2c);
            *(undefined4 *)(in_RDI + 0x1e8) = *(undefined4 *)(local_230 + 6);
            *(undefined4 *)(in_RDI + 0x1ec) = *(undefined4 *)((long)local_230 + 0x34);
            *(undefined4 *)(in_RDI + 0x1f0) = *(undefined4 *)(local_230 + 7);
            *(void **)(in_RDI + 0x1f8) = local_230[8];
          }
          local_248 = &local_420;
          if (local_418 != (int *)0x0) {
            local_11c = 0xffffffff;
            LOCK();
            local_120 = *local_418;
            *local_418 = *local_418 + -1;
            UNLOCK();
            if (local_120 == 1) {
              local_220 = ppvVar3;
              local_118 = local_248;
              if (local_400 == (long *)0x0) {
                if (local_420 != (void *)0x0) {
                  free(local_420);
                }
              }
              else {
                (**(code **)(*local_400 + 0x18))(local_400,local_420);
              }
            }
          }
        }
        local_28c = 0;
      }
    }
  }
  return local_28c;
}

Assistant:

int RNN::load_model(const ModelBin& mb)
{
    int num_directions = direction == 2 ? 2 : 1;

    int size = weight_data_size / num_directions / num_output;

    // raw weight data
    weight_xc_data = mb.load(size, num_output, num_directions, 0);
    if (weight_xc_data.empty())
        return -100;

    bias_c_data = mb.load(num_output, 1, num_directions, 0);
    if (bias_c_data.empty())
        return -100;

    weight_hc_data = mb.load(num_output, num_output, num_directions, 0);
    if (weight_hc_data.empty())
        return -100;

#if NCNN_INT8
    if (int8_scale_term)
    {
        weight_xc_data_int8_scales = mb.load(num_output, num_directions, 1);
        weight_hc_data_int8_scales = mb.load(num_output, num_directions, 1);
    }
#endif // NCNN_INT8

    return 0;
}